

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

void __thiscall cg_other::set(cg_other *this,point p,int ch)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  value_type local_3c;
  cg_other *local_30;
  point local_28;
  uint local_20;
  int local_1c;
  uint i;
  int ch_local;
  cg_other *this_local;
  point p_local;
  
  local_20 = 0;
  local_1c = ch;
  _i = this;
  this_local = (cg_other *)p;
  while( true ) {
    uVar3 = (ulong)local_20;
    sVar4 = std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::size(&this->data);
    if (sVar4 <= uVar3) {
      local_3c.p = (point)this_local;
      local_3c.ch = local_1c;
      std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::push_back
                (&this->data,&local_3c);
      return;
    }
    pvVar5 = std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::operator[]
                       (&this->data,(ulong)local_20);
    local_28 = pvVar5->p;
    local_30 = this_local;
    bVar2 = operator==(local_28,(point)this_local);
    iVar1 = local_1c;
    if (bVar2) break;
    local_20 = local_20 + 1;
  }
  pvVar5 = std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::operator[]
                     (&this->data,(ulong)local_20);
  pvVar5->ch = iVar1;
  return;
}

Assistant:

void cg_other::set(point p, int ch) { //TODO
    for (unsigned i = 0; i < data.size(); i++) {
        if (data[i].p == p) {
            data[i].ch = ch;
            return;
        }
    }
    data.push_back({ p, ch });
}